

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O0

void __thiscall
cmParseCoberturaCoverage::XMLParser::StartElement(XMLParser *this,string *name,char **atts)

{
  cmCTest *pcVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  byte bVar5;
  _Ios_Openmode _Var6;
  int iVar7;
  ostream *poVar8;
  char *pcVar9;
  size_type sVar10;
  reference pvVar11;
  long lVar12;
  mapped_type *this_00;
  reference pvVar13;
  FileLinesType *curFileLines_1;
  int curHits;
  int curNumber;
  int tagCount_1;
  FileLinesType *curFileLines;
  string line;
  string local_660 [32];
  undefined1 local_640 [8];
  ostringstream cmCTestLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  long local_488;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  ulong local_240;
  size_t i_1;
  size_t i;
  undefined1 local_228 [8];
  string filename;
  undefined1 local_1e8 [8];
  ostringstream cmCTestLog_msg;
  int local_70;
  int tagCount;
  string local_60 [8];
  string finalpath;
  string FoundSource;
  char **atts_local;
  string *name_local;
  XMLParser *this_local;
  
  std::__cxx11::string::string((string *)(finalpath.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_60);
  bVar4 = std::operator==(name,"source");
  if (bVar4) {
    this->InSource = true;
    goto LAB_00590fd1;
  }
  bVar4 = std::operator==(name,"sources");
  if (bVar4) {
    this->InSources = true;
    goto LAB_00590fd1;
  }
  bVar4 = std::operator==(name,"class");
  if (!bVar4) {
    bVar4 = std::operator==(name,"line");
    if (bVar4) {
      curHits = 0;
      curFileLines_1._4_4_ = -1;
      curFileLines_1._0_4_ = -1;
      while ((this->SkipThisClass & 1U) == 0) {
        iVar7 = strcmp(atts[curHits],"hits");
        if (iVar7 == 0) {
          curFileLines_1._0_4_ = atoi(atts[curHits + 1]);
        }
        else {
          iVar7 = strcmp(atts[curHits],"number");
          if (iVar7 == 0) {
            curFileLines_1._4_4_ = atoi(atts[curHits + 1]);
          }
        }
        if ((-1 < (int)curFileLines_1) && (0 < curFileLines_1._4_4_)) {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                              (this_00,(long)(curFileLines_1._4_4_ + -1));
          *pvVar13 = (int)curFileLines_1;
          break;
        }
        curHits = curHits + 1;
      }
    }
    goto LAB_00590fd1;
  }
  local_70 = 0;
  while (iVar7 = strcmp(atts[local_70],"filename"), iVar7 != 0) {
    local_70 = local_70 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  poVar8 = std::operator<<((ostream *)local_1e8,"Reading file: ");
  poVar8 = std::operator<<(poVar8,atts[(long)local_70 + 1]);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->CTest;
  std::__cxx11::ostringstream::str();
  pcVar9 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
               ,0x45,pcVar9,(bool)(this->Coverage->Quiet & 1));
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  pcVar9 = atts[(long)local_70 + 1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_228,pcVar9,(allocator *)((long)&i + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  std::__cxx11::string::operator=((string *)&this->CurFileName,"");
  for (i_1 = 0; sVar3 = i_1,
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->FilePaths), sVar3 < sVar10; i_1 = i_1 + 1) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->FilePaths,i_1);
    lVar12 = std::__cxx11::string::find((string *)local_228,(ulong)pvVar11);
    if (lVar12 == 0) {
      std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)local_228);
      break;
    }
  }
  bVar4 = std::operator==(&this->CurFileName,"");
  if (bVar4) {
    for (local_240 = 0; uVar2 = local_240,
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->FilePaths), uVar2 < sVar10; local_240 = local_240 + 1) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->FilePaths,local_240);
      std::operator+(&local_280,pvVar11,"/");
      std::operator+(&local_260,&local_280,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228)
      ;
      std::__cxx11::string::operator=(local_60,(string *)&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_280);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      bVar4 = cmsys::SystemTools::FileExists(pcVar9);
      if (bVar4) {
        std::__cxx11::string::operator=((string *)&this->CurFileName,local_60);
        break;
      }
    }
  }
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_488,pcVar9,_S_in);
  bVar4 = std::operator==(&this->CurFileName,"");
  if ((bVar4) ||
     (bVar5 = std::ios::operator!((ios *)((long)&local_488 + *(long *)(local_488 + -0x18))),
     (bVar5 & 1) != 0)) {
    std::operator+(&local_4c8,&this->Coverage->BinaryDir,"/");
    std::operator+(&local_4a8,&local_4c8,atts[(long)local_70 + 1]);
    std::__cxx11::string::operator=((string *)&this->CurFileName,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    _Var6 = std::__cxx11::string::c_str();
    std::ifstream::open((char *)&local_488,_Var6);
    bVar5 = std::ios::operator!((ios *)((long)&local_488 + *(long *)(local_488 + -0x18)));
    if ((bVar5 & 1) == 0) goto LAB_00590d63;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_640);
    poVar8 = std::operator<<((ostream *)local_640,"Skipping system file ");
    poVar8 = std::operator<<(poVar8,(string *)local_228);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseCoberturaCoverage.cxx"
                 ,0x67,pcVar9,(bool)(this->Coverage->Quiet & 1));
    std::__cxx11::string::~string(local_660);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_640);
    this->SkipThisClass = true;
    line.field_2._12_4_ = 3;
  }
  else {
LAB_00590d63:
    std::__cxx11::string::string((string *)&curFileLines);
    _tagCount_1 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->Coverage->TotalCoverage,&this->CurFileName);
    while (bVar4 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_488,(string *)&curFileLines,(bool *)0x0,-1), bVar4)
    {
      curNumber = -1;
      std::vector<int,_std::allocator<int>_>::push_back(_tagCount_1,&curNumber);
    }
    line.field_2._12_4_ = 3;
    std::__cxx11::string::~string((string *)&curFileLines);
  }
  std::ifstream::~ifstream(&local_488);
  std::__cxx11::string::~string((string *)local_228);
LAB_00590fd1:
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)(finalpath.field_2._M_local_buf + 8));
  return;
}

Assistant:

void StartElement(const std::string& name, const char** atts) CM_OVERRIDE
  {
    std::string FoundSource;
    std::string finalpath;
    if (name == "source") {
      this->InSource = true;
    } else if (name == "sources") {
      this->InSources = true;
    } else if (name == "class") {
      int tagCount = 0;
      while (true) {
        if (strcmp(atts[tagCount], "filename") == 0) {
          cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                             "Reading file: " << atts[tagCount + 1]
                                              << std::endl,
                             this->Coverage.Quiet);
          std::string filename = atts[tagCount + 1];
          this->CurFileName = "";

          // Check if this is an absolute path that falls within our
          // source or binary directories.
          for (size_t i = 0; i < FilePaths.size(); i++) {
            if (filename.find(FilePaths[i]) == 0) {
              this->CurFileName = filename;
              break;
            }
          }

          if (this->CurFileName == "") {
            // Check if this is a path that is relative to our source or
            // binary directories.
            for (size_t i = 0; i < FilePaths.size(); i++) {
              finalpath = FilePaths[i] + "/" + filename;
              if (cmSystemTools::FileExists(finalpath.c_str())) {
                this->CurFileName = finalpath;
                break;
              }
            }
          }

          cmsys::ifstream fin(this->CurFileName.c_str());
          if (this->CurFileName == "" || !fin) {
            this->CurFileName =
              this->Coverage.BinaryDir + "/" + atts[tagCount + 1];
            fin.open(this->CurFileName.c_str());
            if (!fin) {
              cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                                 "Skipping system file " << filename
                                                         << std::endl,
                                 this->Coverage.Quiet);

              this->SkipThisClass = true;
              break;
            }
          }
          std::string line;
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            curFileLines.push_back(-1);
          }

          break;
        }
        ++tagCount;
      }
    } else if (name == "line") {
      int tagCount = 0;
      int curNumber = -1;
      int curHits = -1;
      while (true) {
        if (this->SkipThisClass) {
          break;
        }
        if (strcmp(atts[tagCount], "hits") == 0) {
          curHits = atoi(atts[tagCount + 1]);
        } else if (strcmp(atts[tagCount], "number") == 0) {
          curNumber = atoi(atts[tagCount + 1]);
        }

        if (curHits > -1 && curNumber > 0) {
          FileLinesType& curFileLines =
            this->Coverage.TotalCoverage[this->CurFileName];
          {
            curFileLines[curNumber - 1] = curHits;
          }
          break;
        }
        ++tagCount;
      }
    }
  }